

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::fillConstraintJacobianMultiDof
          (btMultiBody *this,int link,btVector3 *contact_point,btVector3 *normal_ang,
          btVector3 *normal_lin,btScalar *jac,btAlignedObjectArray<float> *scratch_r,
          btAlignedObjectArray<btVector3> *scratch_v,btAlignedObjectArray<btMatrix3x3> *scratch_m)

{
  btMatrix3x3 *pbVar1;
  btScalar *pbVar2;
  btMultibodyLink *pbVar3;
  btVector3 *pbVar4;
  btVector3 *pbVar5;
  int iVar6;
  btVector3 *in_RCX;
  int in_ESI;
  btMultiBody *in_RDI;
  btAlignedObjectArray<btMultibodyLink> *pbVar7;
  btVector3 *in_R8;
  float *in_R9;
  btScalar bVar8;
  btVector3 bVar9;
  btAlignedObjectArray<float> *in_stack_00000008;
  btAlignedObjectArray<btVector3> *in_stack_00000010;
  btAlignedObjectArray<btMatrix3x3> *in_stack_00000018;
  int dof;
  btMatrix3x3 mtx;
  int parent;
  int i_1;
  int i;
  btVector3 omega_coeffs_world;
  btVector3 *normal_ang_world;
  btVector3 *normal_lin_world;
  btVector3 p_minus_com_world;
  btMatrix3x3 *rot_from_world;
  btScalar *results;
  btVector3 *n_local_ang;
  btVector3 *n_local_lin;
  btVector3 *p_minus_com_local;
  btVector3 *v_ptr;
  int m_dofCount;
  int num_links;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  float fVar10;
  btMatrix3x3 *in_stack_fffffffffffffb90;
  float *pfVar11;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  btAlignedObjectArray<btMatrix3x3> *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffc18;
  btScalar in_stack_fffffffffffffc1c;
  btMatrix3x3 *in_stack_fffffffffffffc20;
  btMatrix3x3 *local_2c8;
  int local_298;
  btVector3 local_294;
  undefined8 local_284;
  undefined8 local_27c;
  btVector3 local_274;
  undefined8 local_264;
  undefined8 local_25c;
  btVector3 local_254;
  undefined8 local_244;
  undefined8 local_23c;
  btVector3 local_234;
  undefined8 local_224;
  undefined8 local_21c;
  btVector3 local_214;
  undefined8 local_204;
  undefined8 local_1fc;
  undefined8 local_1f4;
  undefined8 uStack_1ec;
  undefined8 local_1e4;
  undefined8 uStack_1dc;
  undefined8 local_1d4;
  undefined8 uStack_1cc;
  btMatrix3x3 local_1c4 [2];
  int local_164;
  int local_160;
  int local_15c;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  btScalar local_128 [2];
  btScalar abStack_120 [2];
  btVector3 local_118;
  btMatrix3x3 local_100;
  btVector3 *local_d0;
  btVector3 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  btMatrix3x3 *local_b0;
  btMatrix3x3 *local_a8;
  undefined4 local_9c;
  btVector3 *local_98;
  btVector3 *local_90;
  btVector3 *local_88;
  btVector3 *local_80;
  btVector3 local_48;
  int local_38;
  int local_34;
  float *local_30;
  btVector3 *local_28;
  btVector3 *local_20;
  int local_c;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  local_34 = getNumLinks((btMultiBody *)0x241333);
  local_38 = getNumDofs(in_RDI);
  btVector3::btVector3(&local_48);
  btAlignedObjectArray<btVector3>::resize
            ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
             in_stack_fffffffffffffb90->m_el);
  btMatrix3x3::btMatrix3x3(in_stack_fffffffffffffb90);
  btAlignedObjectArray<btMatrix3x3>::resize
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb90);
  local_88 = btAlignedObjectArray<btVector3>::operator[](in_stack_00000010,0);
  local_90 = local_88 + (local_34 + 1);
  local_98 = local_90 + (local_34 + 1);
  local_80 = local_98 + (local_34 + 1);
  local_9c = 0;
  btAlignedObjectArray<float>::resize
            ((btAlignedObjectArray<float> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
             (float *)in_stack_fffffffffffffb90);
  if (local_38 < 1) {
    local_2c8 = (btMatrix3x3 *)0x0;
  }
  else {
    local_2c8 = (btMatrix3x3 *)btAlignedObjectArray<float>::operator[](in_stack_00000008,0);
  }
  local_a8 = local_2c8;
  local_b0 = btAlignedObjectArray<btMatrix3x3>::operator[](in_stack_00000018,0);
  bVar9 = operator-(in_stack_fffffffffffffb90->m_el,
                    (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  local_b8 = bVar9.m_floats._8_8_;
  local_c0 = bVar9.m_floats._0_8_;
  local_c8 = local_28;
  local_d0 = local_20;
  btMatrix3x3::btMatrix3x3
            ((btMatrix3x3 *)in_stack_fffffffffffffba0,
             (btQuaternion *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  btMatrix3x3::operator=(local_b0,&local_100);
  btVector3::btVector3(&local_118);
  bVar9 = btVector3::cross(in_stack_fffffffffffffb90->m_el,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  abStack_120 = bVar9.m_floats._8_8_;
  local_128 = bVar9.m_floats._0_8_;
  local_118.m_floats._0_8_ = local_128;
  local_118.m_floats._8_8_ = abStack_120;
  pbVar2 = btVector3::operator_cast_to_float_(&local_118);
  fVar10 = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(local_d0);
  *local_30 = fVar10 + *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(&local_118);
  fVar10 = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(local_d0);
  local_30[1] = fVar10 + pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(&local_118);
  fVar10 = pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(local_d0);
  local_30[2] = fVar10 + pbVar2[2];
  pbVar2 = btVector3::operator_cast_to_float_(local_c8);
  local_30[3] = *pbVar2;
  pbVar2 = btVector3::operator_cast_to_float_(local_c8);
  local_30[4] = pbVar2[1];
  pbVar2 = btVector3::operator_cast_to_float_(local_c8);
  local_30[5] = pbVar2[2];
  bVar9 = ::operator*(in_stack_fffffffffffffb90,
                      (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  uStack_130 = bVar9.m_floats._8_8_;
  local_138 = bVar9.m_floats._0_8_;
  *(undefined8 *)local_88->m_floats = local_138;
  *(undefined8 *)(local_88->m_floats + 2) = uStack_130;
  bVar9 = ::operator*(in_stack_fffffffffffffb90,
                      (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  uStack_140 = bVar9.m_floats._8_8_;
  local_148 = bVar9.m_floats._0_8_;
  *(undefined8 *)local_90->m_floats = local_148;
  *(undefined8 *)(local_90->m_floats + 2) = uStack_140;
  bVar9 = ::operator*(in_stack_fffffffffffffb90,
                      (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  local_150 = bVar9.m_floats._8_8_;
  local_158 = bVar9.m_floats._0_8_;
  *(undefined8 *)local_98->m_floats = local_158;
  *(undefined8 *)(local_98->m_floats + 2) = local_150;
  for (local_15c = 6; local_15c < local_38 + 6; local_15c = local_15c + 1) {
    local_30[local_15c] = 0.0;
  }
  if ((0 < local_34) && (-1 < local_c)) {
    for (local_160 = 0; local_160 < local_34; local_160 = local_160 + 1) {
      pbVar7 = &in_RDI->m_links;
      pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
      local_164 = pbVar3->m_parent;
      btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
      btMatrix3x3::btMatrix3x3
                ((btMatrix3x3 *)in_stack_fffffffffffffba0,
                 (btQuaternion *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      ::operator*(in_stack_fffffffffffffc20,
                  (btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      btMatrix3x3::operator=(local_b0 + (local_160 + 1),local_1c4);
      bVar9 = ::operator*(in_stack_fffffffffffffb90,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
      uStack_1cc = bVar9.m_floats._8_8_;
      local_1d4 = bVar9.m_floats._0_8_;
      *(undefined8 *)local_90[(long)local_160 + 1].m_floats = local_1d4;
      *(undefined8 *)(local_90[(long)local_160 + 1].m_floats + 2) = uStack_1cc;
      bVar9 = ::operator*(in_stack_fffffffffffffb90,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
      uStack_1dc = bVar9.m_floats._8_8_;
      local_1e4 = bVar9.m_floats._0_8_;
      *(undefined8 *)local_98[(long)local_160 + 1].m_floats = local_1e4;
      *(undefined8 *)(local_98[(long)local_160 + 1].m_floats + 2) = uStack_1dc;
      bVar9 = ::operator*(in_stack_fffffffffffffb90,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
      local_1fc = bVar9.m_floats._8_8_;
      local_204 = bVar9.m_floats._0_8_;
      btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
      bVar9 = operator-(in_stack_fffffffffffffb90->m_el,
                        (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      uStack_1ec = bVar9.m_floats._8_8_;
      local_1f4 = bVar9.m_floats._0_8_;
      *(undefined8 *)local_88[(long)local_160 + 1].m_floats = local_1f4;
      *(undefined8 *)(local_88[(long)local_160 + 1].m_floats + 2) = uStack_1ec;
      pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
      switch(pbVar3->m_jointType) {
      case eRevolute:
        pbVar4 = local_90 + (long)local_160 + 1;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        btMultibodyLink::getAxisTop(pbVar3,0);
        bVar9 = btVector3::cross(in_stack_fffffffffffffb90->m_el,
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_21c = bVar9.m_floats._8_8_;
        local_224 = bVar9.m_floats._0_8_;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        btMultibodyLink::getAxisBottom(pbVar3,0);
        bVar9 = operator+(in_stack_fffffffffffffb90->m_el,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
        local_214.m_floats._8_8_ = bVar9.m_floats._8_8_;
        local_214.m_floats._0_8_ = bVar9.m_floats._0_8_;
        bVar8 = btVector3::dot(pbVar4,&local_214);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset] = bVar8;
        pbVar4 = local_98 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisTop(pbVar3,0);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset] =
             bVar8 + pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset];
        break;
      case ePrismatic:
        pbVar4 = local_90 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisBottom(pbVar3,0);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset] = bVar8;
        break;
      case eSpherical:
        pbVar4 = local_90 + (long)local_160 + 1;
        pbVar7 = &in_RDI->m_links;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        btMultibodyLink::getAxisTop(pbVar3,0);
        bVar9 = btVector3::cross(in_stack_fffffffffffffb90->m_el,
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_23c = bVar9.m_floats._8_8_;
        local_244 = bVar9.m_floats._0_8_;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        btMultibodyLink::getAxisBottom(pbVar3,0);
        bVar9 = operator+(in_stack_fffffffffffffb90->m_el,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
        local_234.m_floats._8_8_ = bVar9.m_floats._8_8_;
        local_234.m_floats._0_8_ = bVar9.m_floats._0_8_;
        bVar8 = btVector3::dot(pbVar4,&local_234);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset] = bVar8;
        pbVar4 = local_90 + (long)local_160 + 1;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        btMultibodyLink::getAxisTop(pbVar3,1);
        bVar9 = btVector3::cross(in_stack_fffffffffffffb90->m_el,
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_25c = bVar9.m_floats._8_8_;
        local_264 = bVar9.m_floats._0_8_;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        btMultibodyLink::getAxisBottom(pbVar3,1);
        bVar9 = operator+(in_stack_fffffffffffffb90->m_el,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
        local_254.m_floats._8_8_ = bVar9.m_floats._8_8_;
        local_254.m_floats._0_8_ = bVar9.m_floats._0_8_;
        in_stack_fffffffffffffc1c = btVector3::dot(pbVar4,&local_254);
        in_stack_fffffffffffffc20 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        in_stack_fffffffffffffc20->m_el[0].m_floats[(long)pbVar3->m_dofOffset + 1] =
             in_stack_fffffffffffffc1c;
        pbVar4 = local_90 + (long)local_160 + 1;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        btMultibodyLink::getAxisTop(pbVar3,2);
        bVar9 = btVector3::cross(in_stack_fffffffffffffb90->m_el,
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_27c = bVar9.m_floats._8_8_;
        local_284 = bVar9.m_floats._0_8_;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](pbVar7,local_160);
        btMultibodyLink::getAxisBottom(pbVar3,2);
        bVar9 = operator+(in_stack_fffffffffffffb90->m_el,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88)
                         );
        local_274.m_floats._8_8_ = bVar9.m_floats._8_8_;
        local_274.m_floats._0_8_ = bVar9.m_floats._0_8_;
        bVar8 = btVector3::dot(pbVar4,&local_274);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset + 2] = bVar8;
        pbVar4 = local_98 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisTop(pbVar3,0);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset] =
             bVar8 + pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset];
        pbVar4 = local_98 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisTop(pbVar3,1);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        iVar6 = pbVar3->m_dofOffset + 1;
        pbVar1->m_el[0].m_floats[iVar6] = bVar8 + pbVar1->m_el[0].m_floats[iVar6];
        pbVar4 = local_98 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisTop(pbVar3,2);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        iVar6 = pbVar3->m_dofOffset + 2;
        pbVar1->m_el[0].m_floats[iVar6] = bVar8 + pbVar1->m_el[0].m_floats[iVar6];
        break;
      case ePlanar:
        in_stack_fffffffffffffba0 =
             (btAlignedObjectArray<btMatrix3x3> *)(local_90 + (long)local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        btMultibodyLink::getAxisTop(pbVar3,0);
        bVar9 = btVector3::cross(in_stack_fffffffffffffb90->m_el,
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_294.m_floats._8_8_ = bVar9.m_floats._8_8_;
        local_294.m_floats._0_8_ = bVar9.m_floats._0_8_;
        bVar8 = btVector3::dot((btVector3 *)in_stack_fffffffffffffba0,&local_294);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset] = bVar8;
        pbVar4 = local_90 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisBottom(pbVar3,1);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset + 1] = bVar8;
        pbVar4 = local_90 + (local_160 + 1);
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar5 = btMultibodyLink::getAxisBottom(pbVar3,2);
        bVar8 = btVector3::dot(pbVar4,pbVar5);
        pbVar1 = local_a8;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_160);
        pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset + 2] = bVar8;
      }
    }
    while (local_c != -1) {
      local_298 = 0;
      while (iVar6 = local_298,
            pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_c),
            pbVar1 = local_a8, iVar6 < pbVar3->m_dofCount) {
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_c);
        fVar10 = pbVar1->m_el[0].m_floats[pbVar3->m_dofOffset + local_298];
        pfVar11 = local_30;
        pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_c);
        pfVar11[pbVar3->m_dofOffset + 6 + local_298] = fVar10;
        local_298 = local_298 + 1;
      }
      pbVar3 = btAlignedObjectArray<btMultibodyLink>::operator[](&in_RDI->m_links,local_c);
      local_c = pbVar3->m_parent;
    }
  }
  return;
}

Assistant:

void btMultiBody::fillConstraintJacobianMultiDof(int link,
                                    const btVector3 &contact_point,
									const btVector3 &normal_ang,
                                    const btVector3 &normal_lin,
                                    btScalar *jac,
                                    btAlignedObjectArray<btScalar> &scratch_r,
                                    btAlignedObjectArray<btVector3> &scratch_v,
                                    btAlignedObjectArray<btMatrix3x3> &scratch_m) const
{
    // temporary space
	int num_links = getNumLinks();
	int m_dofCount = getNumDofs();
    scratch_v.resize(3*num_links + 3);			//(num_links + base) offsets + (num_links + base) normals_lin + (num_links + base) normals_ang
    scratch_m.resize(num_links + 1);

    btVector3 * v_ptr = &scratch_v[0];
    btVector3 * p_minus_com_local = v_ptr; v_ptr += num_links + 1;
    btVector3 * n_local_lin = v_ptr; v_ptr += num_links + 1;
	btVector3 * n_local_ang = v_ptr; v_ptr += num_links + 1;
    btAssert(v_ptr - &scratch_v[0] == scratch_v.size());

    scratch_r.resize(m_dofCount);
    btScalar * results = m_dofCount > 0 ? &scratch_r[0] : 0;

    btMatrix3x3 * rot_from_world = &scratch_m[0];

    const btVector3 p_minus_com_world = contact_point - m_basePos;
	const btVector3 &normal_lin_world = normal_lin;							//convenience
	const btVector3 &normal_ang_world = normal_ang;

    rot_from_world[0] = btMatrix3x3(m_baseQuat);    
    
    // omega coeffients first.
    btVector3 omega_coeffs_world;
    omega_coeffs_world = p_minus_com_world.cross(normal_lin_world);
	jac[0] = omega_coeffs_world[0] + normal_ang_world[0];
	jac[1] = omega_coeffs_world[1] + normal_ang_world[1];
	jac[2] = omega_coeffs_world[2] + normal_ang_world[2];
    // then v coefficients
    jac[3] = normal_lin_world[0];
    jac[4] = normal_lin_world[1];
    jac[5] = normal_lin_world[2];

	//create link-local versions of p_minus_com and normal
	p_minus_com_local[0] = rot_from_world[0] * p_minus_com_world;
    n_local_lin[0] = rot_from_world[0] * normal_lin_world;
	n_local_ang[0] = rot_from_world[0] * normal_ang_world;

    // Set remaining jac values to zero for now.
    for (int i = 6; i < 6 + m_dofCount; ++i) 
	{
        jac[i] = 0;
    }

    // Qdot coefficients, if necessary.
    if (num_links > 0 && link > -1) {

        // TODO: speed this up -- don't calculate for m_links we don't need.
        // (Also, we are making 3 separate calls to this function, for the normal & the 2 friction directions,
        // which is resulting in repeated work being done...)

        // calculate required normals & positions in the local frames.
        for (int i = 0; i < num_links; ++i) {

            // transform to local frame
            const int parent = m_links[i].m_parent;
            const btMatrix3x3 mtx(m_links[i].m_cachedRotParentToThis);
            rot_from_world[i+1] = mtx * rot_from_world[parent+1];

            n_local_lin[i+1] = mtx * n_local_lin[parent+1];
			n_local_ang[i+1] = mtx * n_local_ang[parent+1];
            p_minus_com_local[i+1] = mtx * p_minus_com_local[parent+1] - m_links[i].m_cachedRVector;

			// calculate the jacobian entry
			switch(m_links[i].m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(0));
					break;
				}
				case btMultibodyLink::eSpherical:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisTop(1).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisTop(2).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(2));
										
					results[m_links[i].m_dofOffset + 0] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					results[m_links[i].m_dofOffset + 1] += n_local_ang[i+1].dot(m_links[i].getAxisTop(1));
					results[m_links[i].m_dofOffset + 2] += n_local_ang[i+1].dot(m_links[i].getAxisTop(2));

					break;
				}
				case btMultibodyLink::ePlanar:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]));// + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(2));

					break;
				}
				default:
				{
				}
			}
            
        }

        // Now copy through to output.
		//printf("jac[%d] = ", link);
        while (link != -1) 
		{
			for(int dof = 0; dof < m_links[link].m_dofCount; ++dof)
			{
				jac[6 + m_links[link].m_dofOffset + dof] = results[m_links[link].m_dofOffset + dof];
				//printf("%.2f\t", jac[6 + m_links[link].m_dofOffset + dof]);
			}
            
			link = m_links[link].m_parent;
        }
		//printf("]\n");
    }
}